

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_xml_ExpatParser.cpp
# Opt level: O0

bool __thiscall
axl::xml::ExpatParserRoot::parseFile(ExpatParserRoot *this,StringRef *fileName,size_t blockSize)

{
  uint uVar1;
  Module *this_00;
  SystemInfo *pSVar2;
  uint64_t uVar3;
  ulong in_RDX;
  char *in_RSI;
  uint64_t size;
  uint64_t offset;
  void *p;
  size_t alignFactor;
  SimpleMappedFile mappedFile;
  bool result;
  undefined6 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  SimpleMappedFile *in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefe;
  byte in_stack_fffffffffffffeff;
  SimpleMappedFile *in_stack_ffffffffffffff00;
  bool local_ba;
  long local_a8;
  SimpleMappedFile local_80;
  byte local_21;
  ulong local_20;
  char *local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  io::SimpleMappedFile::SimpleMappedFile(in_stack_ffffffffffffff00);
  if ((local_20 == 0) || (local_20 == 0xffffffffffffffff)) {
    uVar1 = io::SimpleMappedFile::open(&local_80,local_18,1);
    local_ba = false;
    if ((uVar1 & 1) != 0) {
      io::SimpleMappedFile::p((SimpleMappedFile *)0x151d41);
      io::SimpleMappedFile::getFileSize((SimpleMappedFile *)0x151d55);
      local_ba = parse((ExpatParserRoot *)in_stack_ffffffffffffff00,
                       (void *)CONCAT17(in_stack_fffffffffffffeff,
                                        CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8
                                                )),(size_t)in_stack_fffffffffffffef0,
                       (bool)in_stack_fffffffffffffeef);
    }
    local_1 = local_ba;
  }
  else {
    this_00 = g::getModule();
    pSVar2 = g::Module::getSystemInfo(this_00);
    local_20 = (local_20 - 1) + pSVar2->m_mappingAlignFactor & -pSVar2->m_mappingAlignFactor;
    uVar1 = io::SimpleMappedFile::open(&local_80,local_18,0,0,1);
    local_21 = (byte)uVar1 & 1;
    if ((uVar1 & 1) == 0) {
      local_1 = false;
    }
    else {
      local_a8 = 0;
      uVar3 = io::SimpleMappedFile::getFileSize((SimpleMappedFile *)0x151e86);
      for (; local_a8 + local_20 < uVar3; local_a8 = local_20 + local_a8) {
        in_stack_ffffffffffffff00 =
             (SimpleMappedFile *)
             io::SimpleMappedFile::view
                       (in_stack_fffffffffffffef0,
                        CONCAT17(in_stack_fffffffffffffeef,
                                 CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)),
                        0x151ec9);
        in_stack_fffffffffffffeff = false;
        if (in_stack_ffffffffffffff00 != (SimpleMappedFile *)0x0) {
          in_stack_fffffffffffffefe =
               parse((ExpatParserRoot *)in_stack_ffffffffffffff00,
                     (void *)(ulong)CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8),
                     (size_t)in_stack_fffffffffffffef0,(bool)in_stack_fffffffffffffeef);
          in_stack_fffffffffffffeff = in_stack_fffffffffffffefe;
        }
        local_21 = in_stack_fffffffffffffeff;
        if ((bool)in_stack_fffffffffffffeff == false) {
          local_1 = false;
          goto LAB_00151fe5;
        }
      }
      local_20 = uVar3 - local_a8;
      in_stack_fffffffffffffef0 =
           (SimpleMappedFile *)
           io::SimpleMappedFile::view
                     (in_stack_fffffffffffffef0,
                      CONCAT17(in_stack_fffffffffffffeef,
                               CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)),
                      0x151f84);
      local_1 = false;
      if (in_stack_fffffffffffffef0 != (SimpleMappedFile *)0x0) {
        local_1 = parse((ExpatParserRoot *)in_stack_ffffffffffffff00,
                        (void *)CONCAT17(in_stack_fffffffffffffeff,
                                         CONCAT16(in_stack_fffffffffffffefe,
                                                  in_stack_fffffffffffffef8)),
                        (size_t)in_stack_fffffffffffffef0,false);
      }
    }
  }
LAB_00151fe5:
  io::SimpleMappedFile::~SimpleMappedFile(in_stack_fffffffffffffef0);
  return (bool)(local_1 & 1);
}

Assistant:

bool
ExpatParserRoot::parseFile(
	const sl::StringRef& fileName,
	size_t blockSize
) {
	bool result;

	io::SimpleMappedFile mappedFile;

	if (!blockSize || blockSize == -1) {
		return
			mappedFile.open(fileName, io::FileFlag_ReadOnly) &&
			parse(mappedFile.p(), (size_t)mappedFile.getFileSize(), true);
	}

	// round-up block size

	size_t alignFactor = g::getModule()->getSystemInfo()->m_mappingAlignFactor;
	blockSize = (blockSize + alignFactor - 1) & ~(alignFactor - 1);

	result = mappedFile.open(fileName, 0, 0, io::FileFlag_ReadOnly);
	if (!result)
		return false;

	void* p;
	uint64_t offset = 0;
	uint64_t size = mappedFile.getFileSize();

	while (offset + blockSize < size) {
		result =
			(p = mappedFile.view(offset, blockSize)) &&
			parse(p, blockSize, false);

		if (!result)
			return false;

		offset += blockSize;
	}

	// final block

	blockSize = (size_t)(size - offset);

	return
		(p = mappedFile.view(offset, blockSize)) &&
		parse(p, blockSize, true);
}